

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O3

int __thiscall
pstore::sstring_view<std::shared_ptr<const_char>_>::compare<char[1]>
          (sstring_view<std::shared_ptr<const_char>_> *this,char (*s) [1])

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar3 = strlen(*s);
  uVar2 = this->size_;
  uVar5 = uVar2;
  if (sVar3 < uVar2) {
    uVar5 = sVar3;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      cVar1 = (this->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[uVar6];
      if (cVar1 < s[uVar6][0]) {
        return -1;
      }
      if (s[uVar6][0] < cVar1) {
        return 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  uVar4 = 0;
  if (uVar2 != sVar3) {
    uVar4 = -(uint)(uVar2 < sVar3) | 1;
  }
  return uVar4;
}

Assistant:

int sstring_view<PointerType>::compare (StringType const & s) const {
        auto const slen = string_traits<StringType>::length (s);
        size_type const common_len = std::min (size (), slen);
        int result = traits::compare (data (), string_traits<StringType>::data (s), common_len);
        if (result == 0) {
            result = (size () == slen) ? 0 : (size () < slen ? -1 : 1);
        }
        return result;
    }